

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall
Buffer_recycles_pages_Test::~Buffer_recycles_pages_Test(Buffer_recycles_pages_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, recycles_pages) {
    auto constexpr str = std::string_view { "1234567890" };
    auto array = std::array<char, 16> {};
    bfy_buffer buf = bfy_buffer_init_unmanaged(std::data(array), std::size(array));
    EXPECT_EQ(0, buffer_count_pages(&buf));

    bfy_buffer_add(&buf, std::data(str), std::size(str));
    EXPECT_EQ(10, bfy_buffer_get_content_len(&buf));
    EXPECT_EQ(6, bfy_buffer_get_space_len(&buf));
    EXPECT_EQ(1, buffer_count_pages(&buf));

    bfy_buffer_remove(&buf, 5, std::data(array));
    EXPECT_EQ(5, bfy_buffer_get_content_len(&buf));
    EXPECT_EQ(6, bfy_buffer_get_space_len(&buf));
    EXPECT_EQ(1, buffer_count_pages(&buf));

    // now there's not enough space at the end of the page,
    // but there will be if it realigns the content back to
    // the front of the page...
    bfy_buffer_add(&buf, std::data(str), std::size(str));
    EXPECT_EQ(15, bfy_buffer_get_content_len(&buf));
    EXPECT_EQ(1, bfy_buffer_get_space_len(&buf));
    EXPECT_EQ(1, buffer_count_pages(&buf));

    bfy_buffer_destruct(&buf);
}